

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall Fl_Text_Display::measure_deleted_lines(Fl_Text_Display *this,int pos,int nDeleted)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Fl_Text_Buffer *this_00;
  int local_58;
  int local_54;
  int i;
  int nLines;
  int lineStart;
  int countFrom;
  int *lineStarts;
  int nVisLines;
  Fl_Text_Buffer *buf;
  int retLineEnd;
  int retLineStart;
  int retLines;
  int retPos;
  int nDeleted_local;
  int pos_local;
  Fl_Text_Display *this_local;
  
  retLines = nDeleted;
  retPos = pos;
  _nDeleted_local = this;
  this_00 = buffer(this);
  piVar1 = this->mLineStarts;
  local_54 = 0;
  if ((retPos < this->mFirstChar) || (local_58 = this->mNVisibleLines, this->mLastChar < retPos)) {
    nLines = Fl_Text_Buffer::line_start(this_00,retPos);
  }
  else {
    do {
      iVar2 = local_58;
      local_58 = iVar2 + -1;
      if (local_58 < 1) break;
    } while ((piVar1[local_58] == -1) || (retPos < piVar1[local_58]));
    if (local_58 < 1) {
      nLines = Fl_Text_Buffer::line_start(this_00,retPos);
    }
    else {
      nLines = piVar1[iVar2 + -2];
    }
  }
  i = nLines;
  do {
    iVar2 = Fl_Text_Buffer::length(this_00);
    wrapped_line_counter
              (this,this_00,i,iVar2,1,true,0,&retLineStart,&retLineEnd,(int *)((long)&buf + 4),
               (int *)&buf,true);
    iVar2 = retLineStart;
    iVar3 = Fl_Text_Buffer::length(this_00);
    if (iVar3 <= iVar2) {
      if (retLineStart != (int)buf) {
        local_54 = local_54 + 1;
      }
      break;
    }
    i = retLineStart;
    local_54 = local_54 + 1;
  } while ((retLineStart <= retPos + retLines) ||
          (uVar4 = Fl_Text_Buffer::char_at(this_00,retLineStart + -1), uVar4 != 10));
  this->mNLinesDeleted = local_54;
  this->mSuppressResync = 1;
  return;
}

Assistant:

void Fl_Text_Display::measure_deleted_lines(int pos, int nDeleted) {
  IS_UTF8_ALIGNED2(buffer(), pos)

  int retPos, retLines, retLineStart, retLineEnd;
  Fl_Text_Buffer *buf = buffer();
  int nVisLines = mNVisibleLines;
  int *lineStarts = mLineStarts;
  int countFrom, lineStart;
  int nLines = 0, i;
  /*
   ** Determine where to begin searching: either the previous newline, or
   ** if possible, limit to the start of the (original) previous displayed
   ** line, using information from the existing line starts array
   */
  if (pos >= mFirstChar && pos <= mLastChar) {
    for (i=nVisLines-1; i>0; i--)
      if (lineStarts[i] != -1 && pos >= lineStarts[i])
        break;
    if (i > 0) {
      countFrom = lineStarts[i-1];
    } else
      countFrom = buf->line_start(pos);
  } else
    countFrom = buf->line_start(pos);

  /*
   ** Move forward through the (new) text one line at a time, counting
   ** displayed lines, and looking for either a real newline, or for the
   ** line starts to re-sync with the original line starts array
   */
  lineStart = countFrom;
  for (;;) {
    /* advance to the next line.  If the line ended in a real newline
     or the end of the buffer, that's far enough */
    wrapped_line_counter(buf, lineStart, buf->length(), 1, true, 0,
                         &retPos, &retLines, &retLineStart, &retLineEnd);
    if (retPos >= buf->length()) {
      if (retPos != retLineEnd)
        nLines++;
      break;
    } else
      lineStart = retPos;
    nLines++;
    if (lineStart > pos + nDeleted && buf->char_at(lineStart-1) == '\n') {
      break;
    }

    /* Unlike in the findWrapRange() function above, we don't try to
     resync with the line starts, because we don't know the length
     of the inserted text yet, nor the updated style information.

     Because of that, we also shouldn't resync with the line starts
     after the modification either, because we must perform the
     calculations for the deleted and inserted lines in the same way.

     This can result in some unnecessary recalculation and redrawing
     overhead, and therefore we should only use this two-phase mode
     of calculation when it's really needed (continuous wrap + variable
     font width). */
  }
  mNLinesDeleted = nLines;
  mSuppressResync = 1;
}